

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

void new_declaration(Grammar *g,Elem *e,uint kind)

{
  uint uVar1;
  Declaration *elem;
  Declaration *d;
  uint kind_local;
  Elem *e_local;
  Grammar *g_local;
  
  elem = (Declaration *)malloc(0x10);
  elem->elem = e;
  elem->kind = kind;
  elem->index = (g->declarations).n;
  if ((g->declarations).v == (Declaration **)0x0) {
    (g->declarations).v = (g->declarations).e;
    uVar1 = (g->declarations).n;
    (g->declarations).n = uVar1 + 1;
    (g->declarations).e[uVar1] = elem;
  }
  else {
    if ((g->declarations).v == (g->declarations).e) {
      if ((g->declarations).n < 3) {
        uVar1 = (g->declarations).n;
        (g->declarations).n = uVar1 + 1;
        (g->declarations).v[uVar1] = elem;
        return;
      }
    }
    else if (((g->declarations).n & 7) != 0) {
      uVar1 = (g->declarations).n;
      (g->declarations).n = uVar1 + 1;
      (g->declarations).v[uVar1] = elem;
      return;
    }
    vec_add_internal(&g->declarations,elem);
  }
  return;
}

Assistant:

void new_declaration(Grammar *g, Elem *e, uint kind) {
  Declaration *d = MALLOC(sizeof(*d));
  d->elem = e;
  d->kind = kind;
  d->index = g->declarations.n;
  vec_add(&g->declarations, d);
}